

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O1

HighsStatus
readSolutionFile(string *filename,HighsOptions *options,HighsLp *lp,HighsBasis *basis,
                HighsSolution *solution,HighsInt style)

{
  pointer pcVar1;
  HighsBasis *pHVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  HighsStatus HVar6;
  undefined7 extraout_var;
  iterator iVar7;
  char *format;
  long lVar8;
  uint uVar9;
  size_type sVar10;
  HighsLogOptions *log_options_;
  HighsInt num_col;
  HighsInt num_row;
  HighsInt iCol;
  double value;
  string keyword;
  string name;
  HighsSolution read_solution;
  string section_name;
  HighsBasis read_basis;
  ifstream in_file;
  uint local_39c;
  uint local_398;
  undefined4 local_394;
  value_type_conflict1 local_390;
  double local_388;
  size_type local_380;
  HighsBasis *local_378;
  size_type local_370;
  HighsSolution *local_368;
  string local_360;
  string local_340;
  HighsSolution local_320;
  string local_2b8;
  undefined1 local_298 [16];
  _Alloc_hider local_288;
  char local_278 [16];
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_268;
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> local_250;
  undefined1 local_238 [520];
  
  log_options_ = &(options->super_HighsOptionsStruct).log_options;
  if ((style & 0xfffffffbU) != 0) {
    highsLogUser(log_options_,kError,"readSolutionFile: Cannot read file of style %d\n",
                 (ulong)(uint)style);
    return kError;
  }
  local_378 = basis;
  std::ifstream::ifstream(local_238,(string *)filename,_S_in);
  if (((byte)(*(_func_int **)(local_238._0_8_ + -0x18))[(long)(local_238 + 0x20)] & 5) != 0) {
    HVar6 = kError;
    highsLogUser(log_options_,kError,"readSolutionFile: Cannot open readable file \"%s\"\n",
                 (filename->_M_dataplus)._M_p);
    goto LAB_00246ca5;
  }
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  local_360._M_string_length = 0;
  local_360.field_2._M_local_buf[0] = '\0';
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  local_340._M_string_length = 0;
  local_340.field_2._M_local_buf[0] = '\0';
  local_380 = (size_type)lp->num_col_;
  local_370 = (size_type)lp->num_row_;
  local_320.value_valid = solution->value_valid;
  local_320.dual_valid = solution->dual_valid;
  std::vector<double,_std::allocator<double>_>::vector(&local_320.col_value,&solution->col_value);
  std::vector<double,_std::allocator<double>_>::vector(&local_320.col_dual,&solution->col_dual);
  std::vector<double,_std::allocator<double>_>::vector(&local_320.row_value,&solution->row_value);
  local_368 = solution;
  std::vector<double,_std::allocator<double>_>::vector(&local_320.row_dual,&solution->row_dual);
  pHVar2 = local_378;
  local_298._8_4_ = local_378->debug_update_count;
  local_298[0] = local_378->valid;
  local_298[1] = local_378->alien;
  local_298[2] = local_378->useful;
  local_298[3] = local_378->was_alien;
  local_298._4_4_ = local_378->debug_id;
  local_288._M_p = local_278;
  pcVar1 = (local_378->debug_origin_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_288,pcVar1,pcVar1 + (local_378->debug_origin_name)._M_string_length);
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::vector
            (&local_268,&pHVar2->col_status);
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::vector
            (&local_250,&pHVar2->row_status);
  HighsSolution::clear(&local_320);
  sVar10 = local_380;
  HighsBasis::clear((HighsBasis *)local_298);
  std::vector<double,_std::allocator<double>_>::resize(&local_320.col_value,sVar10);
  std::vector<double,_std::allocator<double>_>::resize(&local_320.row_value,local_370);
  std::vector<double,_std::allocator<double>_>::resize(&local_320.col_dual,sVar10);
  std::vector<double,_std::allocator<double>_>::resize(&local_320.row_dual,local_370);
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize(&local_268,sVar10);
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize(&local_250,local_370);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  local_2b8._M_string_length = 0;
  local_2b8.field_2._M_local_buf[0] = '\0';
  bVar3 = readSolutionFileIdIgnoreLineOk(&local_2b8,(ifstream *)local_238);
  if (bVar3) {
    iVar4 = std::__cxx11::string::compare((char *)&local_2b8);
    if (iVar4 == 0) {
      if ((lp->col_names_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (lp->col_names_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        if ((lp->col_hash_).name2index._M_h._M_element_count == 0) {
          HighsNameHash::form(&lp->col_hash_,&lp->col_names_);
        }
        local_394 = 0;
        goto LAB_002468de;
      }
      HVar6 = kError;
      highsLogUser(log_options_,kError,
                   "readSolutionFile: Cannot read a MIPLIB solution file without column names in the model\n"
                  );
    }
    else {
      uVar9 = *(uint *)(*(_func_int **)(local_238._0_8_ + -0x18) + (long)(local_238 + 0x20));
      if (((((uVar9 & 2) == 0) && (std::istream::ignore((long)local_238,0x50), (uVar9 & 2) == 0)) &&
          (uVar9 = *(uint *)(*(_func_int **)(local_238._0_8_ + -0x18) + (long)(local_238 + 0x20)),
          (uVar9 & 2) == 0)) &&
         (((std::istream::ignore((long)local_238,0x50), (uVar9 & 2) == 0 &&
           (uVar9 = *(uint *)(*(_func_int **)(local_238._0_8_ + -0x18) + (long)(local_238 + 0x20)),
           (uVar9 & 2) == 0)) &&
          ((std::istream::ignore((long)local_238,0x50), (uVar9 & 2) == 0 &&
           ((uVar9 = *(uint *)(*(_func_int **)(local_238._0_8_ + -0x18) + (long)(local_238 + 0x20)),
            (uVar9 & 2) == 0 &&
            (std::operator>>((istream *)local_238,(string *)&local_360), (uVar9 & 2) == 0)))))))) {
        iVar5 = std::__cxx11::string::compare((char *)&local_360);
        if (iVar5 == 0) {
          HVar6 = kWarning;
          std::ifstream::close();
          goto LAB_00246bdd;
        }
        uVar9 = *(uint *)(*(_func_int **)(local_238._0_8_ + -0x18) + (long)(local_238 + 0x20));
        if (((((uVar9 & 2) != 0) || (std::istream::ignore((long)local_238,0x50), (uVar9 & 2) != 0))
            || (uVar9 = *(uint *)(*(_func_int **)(local_238._0_8_ + -0x18) +
                                 (long)(local_238 + 0x20)), (uVar9 & 2) != 0)) ||
           ((std::istream::ignore((long)local_238,0x50), (uVar9 & 2) != 0 ||
            (bVar3 = readSolutionFileHashKeywordIntLineOk
                               (&local_360,(HighsInt *)&local_39c,(ifstream *)local_238), !bVar3))))
        goto LAB_00246bcb;
        sVar10 = local_380;
        if ((int)local_39c < 1) {
          local_39c = -local_39c;
          local_394 = (undefined4)CONCAT71(extraout_var,1);
        }
        else {
          if (local_39c != (uint)local_380) {
            highsLogUser(log_options_,kError,
                         "readSolutionFile: Solution file is for %d columns, not %d\n",
                         (ulong)local_39c,local_380);
            goto LAB_00246bcb;
          }
          local_394 = 0;
        }
LAB_002468de:
        if (iVar4 == 0) {
          local_390 = 0.0;
          std::vector<double,_std::allocator<double>_>::_M_fill_assign
                    (&local_320.col_value,sVar10,&local_390);
          do {
            bVar3 = readSolutionFileIdDoubleLineOk(&local_340,&local_388,(ifstream *)local_238);
            if (!bVar3) goto LAB_00246aa0;
            iVar7 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            *)&lp->col_hash_,&local_340);
            format = "readSolutionFile: name %s is not found\n";
            if (iVar7.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                ._M_cur == (__node_type *)0x0) {
LAB_00246a24:
              uVar9 = 1;
              highsLogUser(log_options_,kError,format,local_340._M_dataplus._M_p);
            }
            else {
              format = "readSolutionFile: name %s is duplicated\n";
              if ((long)*(int *)((long)iVar7.
                                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                                       ._M_cur + 0x28) == -1) goto LAB_00246a24;
              local_320.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start
              [*(int *)((long)iVar7.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                              ._M_cur + 0x28)] = local_388;
              uVar9 = *(uint *)(*(_func_int **)(local_238._0_8_ + -0x18) + (long)(local_238 + 0x20))
                      & 2;
            }
          } while (uVar9 == 0);
          if (uVar9 != 2) {
LAB_00246d18:
            HVar6 = kError;
            goto LAB_00246bdd;
          }
        }
        else if ((char)local_394 == '\0') {
          if (0 < (int)local_39c) {
            lVar8 = 0;
            do {
              bVar3 = readSolutionFileIdDoubleLineOk(&local_340,&local_388,(ifstream *)local_238);
              if (!bVar3) {
                HVar6 = kError;
                std::ifstream::close();
                goto LAB_00246bdd;
              }
              local_320.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8] = local_388;
              lVar8 = lVar8 + 1;
            } while (lVar8 < (int)local_39c);
          }
        }
        else {
          local_390 = 0.0;
          std::vector<double,_std::allocator<double>_>::_M_fill_assign
                    (&local_320.col_value,sVar10,&local_390);
          if (0 < (int)local_39c) {
            iVar4 = 0;
            do {
              bVar3 = readSolutionFileIdDoubleIntLineOk
                                (&local_388,(HighsInt *)&local_390,(ifstream *)local_238);
              if (!bVar3) {
                std::ifstream::close();
                goto LAB_00246d18;
              }
              local_320.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[local_390._0_4_] = local_388;
              iVar4 = iVar4 + 1;
            } while (iVar4 < (int)local_39c);
          }
        }
LAB_00246aa0:
        local_320.value_valid = true;
        if ((char)local_394 == '\0') {
          bVar3 = readSolutionFileHashKeywordIntLineOk
                            (&local_360,(HighsInt *)&local_398,(ifstream *)local_238);
          uVar9 = local_398;
          if (bVar3) {
            if (0 < (int)local_398) {
              lVar8 = 0;
              do {
                bVar3 = readSolutionFileIdDoubleLineOk(&local_340,&local_388,(ifstream *)local_238);
                if (!bVar3) {
                  HVar6 = kError;
                  std::ifstream::close();
                  goto LAB_00246bdd;
                }
                if (uVar9 == (uint)local_370) {
                  local_320.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar8] = local_388;
                }
                lVar8 = lVar8 + 1;
              } while (lVar8 < (int)local_398);
            }
            if (uVar9 == (uint)local_370) {
LAB_00246d22:
              uVar9 = *(uint *)(*(_func_int **)(local_238._0_8_ + -0x18) + (long)(local_238 + 0x20))
              ;
              if ((((uVar9 & 2) == 0) &&
                  (std::istream::ignore((long)local_238,0x50), (uVar9 & 2) == 0)) &&
                 ((uVar9 = *(uint *)(*(_func_int **)(local_238._0_8_ + -0x18) +
                                    (long)(local_238 + 0x20)), (uVar9 & 2) == 0 &&
                  (((std::istream::ignore((long)local_238,0x50), (uVar9 & 2) == 0 &&
                    (uVar9 = *(uint *)(*(_func_int **)(local_238._0_8_ + -0x18) +
                                      (long)(local_238 + 0x20)), (uVar9 & 2) == 0)) &&
                   (std::istream::ignore((long)local_238,0x50), (uVar9 & 2) == 0)))))) {
                uVar9 = *(uint *)(*(_func_int **)(local_238._0_8_ + -0x18) +
                                 (long)(local_238 + 0x20));
                if (((uVar9 & 2) != 0) ||
                   (std::operator>>((istream *)local_238,(string *)&local_360), (uVar9 & 2) != 0))
                goto LAB_00246b92;
                iVar4 = std::__cxx11::string::compare((char *)&local_360);
                if (iVar4 != 0) {
                  uVar9 = *(uint *)(*(_func_int **)(local_238._0_8_ + -0x18) +
                                   (long)(local_238 + 0x20));
                  if (((uVar9 & 2) != 0) ||
                     (std::istream::ignore((long)local_238,0x50), (uVar9 & 2) != 0))
                  goto LAB_00246b92;
                  bVar3 = readSolutionFileHashKeywordIntLineOk
                                    (&local_360,(HighsInt *)&local_39c,(ifstream *)local_238);
                  if (!bVar3) goto LAB_00247103;
                  if (0 < (int)local_39c) {
                    lVar8 = 0;
                    do {
                      bVar3 = readSolutionFileIdDoubleLineOk
                                        (&local_340,&local_390,(ifstream *)local_238);
                      if (!bVar3) {
                        std::ifstream::close();
                        goto LAB_0024700c;
                      }
                      local_320.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl
                      .super__Vector_impl_data._M_start[lVar8] = local_390;
                      lVar8 = lVar8 + 1;
                    } while (lVar8 < (int)local_39c);
                  }
                  bVar3 = readSolutionFileHashKeywordIntLineOk
                                    (&local_360,(HighsInt *)&local_398,(ifstream *)local_238);
                  if (bVar3) {
                    bVar3 = (int)local_398 < 1;
                    HVar6 = kError;
                    if (0 < (int)local_398) {
                      lVar8 = 0;
LAB_00246f16:
                      bVar3 = readSolutionFileIdDoubleLineOk
                                        (&local_340,&local_390,(ifstream *)local_238);
                      if (bVar3) goto code_r0x00246f2e;
                      std::ifstream::close();
LAB_0024700c:
                      HVar6 = kError;
                      bVar3 = false;
                    }
                  }
                  else {
                    bVar3 = false;
                    HVar6 = readSolutionFileReturn
                                      (kOk,local_368,local_378,&local_320,(HighsBasis *)local_298,
                                       (ifstream *)local_238);
                  }
LAB_0024700f:
                  if (!bVar3) goto LAB_00246bdd;
                }
                uVar9 = *(uint *)(*(_func_int **)(local_238._0_8_ + -0x18) +
                                 (long)(local_238 + 0x20));
                if (((((uVar9 & 2) == 0) &&
                     (std::istream::ignore((long)local_238,0x50), (uVar9 & 2) == 0)) &&
                    (uVar9 = *(uint *)(*(_func_int **)(local_238._0_8_ + -0x18) +
                                      (long)(local_238 + 0x20)), (uVar9 & 2) == 0)) &&
                   (((std::istream::ignore((long)local_238,0x50), (uVar9 & 2) == 0 &&
                     (uVar9 = *(uint *)(*(_func_int **)(local_238._0_8_ + -0x18) +
                                       (long)(local_238 + 0x20)), (uVar9 & 2) == 0)) &&
                    (std::istream::ignore((long)local_238,0x50), (uVar9 & 2) == 0)))) {
                  HVar6 = readBasisStream(log_options_,(HighsBasis *)local_298,(ifstream *)local_238
                                         );
                  HVar6 = readSolutionFileReturn
                                    (HVar6,local_368,local_378,&local_320,(HighsBasis *)local_298,
                                     (ifstream *)local_238);
                  goto LAB_00246bdd;
                }
              }
LAB_00247103:
              HVar6 = readSolutionFileReturn
                                (kOk,local_368,local_378,&local_320,(HighsBasis *)local_298,
                                 (ifstream *)local_238);
            }
            else {
              highsLogUser(log_options_,kWarning,
                           "readSolutionFile: Solution file is for %d rows, not %d: row values ignored\n"
                           ,(ulong)local_398);
              HVar6 = calculateRowValuesQuad(lp,&local_320.col_value,&local_320.row_value,-1);
              if (HVar6 == kOk) goto LAB_00246d22;
LAB_00246b92:
              HVar6 = kError;
              std::ifstream::close();
            }
            goto LAB_00246bdd;
          }
          HVar6 = calculateRowValuesQuad(lp,&local_320.col_value,&local_320.row_value,-1);
        }
        else {
          HVar6 = calculateRowValuesQuad(lp,&local_320.col_value,&local_320.row_value,-1);
        }
        if (HVar6 == kOk) {
          HVar6 = readSolutionFileReturn
                            (kOk,local_368,local_378,&local_320,(HighsBasis *)local_298,
                             (ifstream *)local_238);
          goto LAB_00246bdd;
        }
      }
LAB_00246bcb:
      HVar6 = kError;
      std::ifstream::close();
    }
  }
  else {
    HVar6 = kError;
    std::ifstream::close();
  }
LAB_00246bdd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  if (local_250.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_250.
                    super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_268.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_268.
                    super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_288._M_p != local_278) {
    operator_delete(local_288._M_p);
  }
  if (local_320.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_320.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_320.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_320.row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_320.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_320.col_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_320.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_320.col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p);
  }
LAB_00246ca5:
  std::ifstream::~ifstream(local_238);
  return HVar6;
code_r0x00246f2e:
  local_320.row_dual.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[lVar8] = local_390;
  lVar8 = lVar8 + 1;
  bVar3 = (int)local_398 <= lVar8;
  if ((int)local_398 <= lVar8) goto LAB_0024700f;
  goto LAB_00246f16;
}

Assistant:

HighsStatus readSolutionFile(const std::string filename,
                             const HighsOptions& options, HighsLp& lp,
                             HighsBasis& basis, HighsSolution& solution,
                             const HighsInt style) {
  const HighsLogOptions& log_options = options.log_options;
  if (style != kSolutionStyleRaw && style != kSolutionStyleSparse) {
    highsLogUser(log_options, HighsLogType::kError,
                 "readSolutionFile: Cannot read file of style %d\n",
                 (int)style);
    return HighsStatus::kError;
  }
  std::ifstream in_file(filename);
  if (in_file.fail()) {
    highsLogUser(log_options, HighsLogType::kError,
                 "readSolutionFile: Cannot open readable file \"%s\"\n",
                 filename.c_str());
    return HighsStatus::kError;
  }
  std::string keyword;
  std::string name;
  double value;
  HighsInt num_col;
  HighsInt num_row;
  const HighsInt lp_num_col = lp.num_col_;
  const HighsInt lp_num_row = lp.num_row_;
  // Define identifiers for reading in
  HighsSolution read_solution = solution;
  HighsBasis read_basis = basis;
  read_solution.clear();
  read_basis.clear();
  read_solution.col_value.resize(lp_num_col);
  read_solution.row_value.resize(lp_num_row);
  read_solution.col_dual.resize(lp_num_col);
  read_solution.row_dual.resize(lp_num_row);
  read_basis.col_status.resize(lp_num_col);
  read_basis.row_status.resize(lp_num_row);
  std::string section_name;
  if (!readSolutionFileIdIgnoreLineOk(section_name, in_file))
    return readSolutionFileErrorReturn(
        in_file);  // Model (status) or =obj= (value)
  const bool miplib_sol = section_name == "=obj=";
  if (miplib_sol) {
    // A MIPLIB solution file has nonzero solution values for a subset
    // of the variables identified by name, so there must be column
    // names
    if (!lp.col_names_.size()) {
      highsLogUser(log_options, HighsLogType::kError,
                   "readSolutionFile: Cannot read a MIPLIB solution file "
                   "without column names in the model\n");
      return HighsStatus::kError;
    }
    // Ensure that the col name hash table has been formed
    if (!lp.col_hash_.name2index.size()) lp.col_hash_.form(lp.col_names_);
  }
  bool sparse = false;
  if (!miplib_sol) {
    if (!readSolutionFileIgnoreLineOk(in_file))
      return readSolutionFileErrorReturn(in_file);  // Optimal
    if (!readSolutionFileIgnoreLineOk(in_file))
      return readSolutionFileErrorReturn(in_file);  //
    if (!readSolutionFileIgnoreLineOk(in_file))
      return readSolutionFileErrorReturn(in_file);  // # Primal solution values
    if (!readSolutionFileKeywordLineOk(keyword, in_file))
      return readSolutionFileErrorReturn(in_file);
    // Read in the primal solution values: return warning if there is none
    if (keyword == "None")
      return readSolutionFileReturn(HighsStatus::kWarning, solution, basis,
                                    read_solution, read_basis, in_file);
    // If there are primal solution values then keyword is the status
    // and the next line is objective
    if (!readSolutionFileIgnoreLineOk(in_file))
      return readSolutionFileErrorReturn(in_file);  // EOL
    if (!readSolutionFileIgnoreLineOk(in_file))
      return readSolutionFileErrorReturn(in_file);  // Objective
    // Next line should be "Columns" and correct number
    if (!readSolutionFileHashKeywordIntLineOk(keyword, num_col, in_file))
      return readSolutionFileErrorReturn(in_file);
    assert(keyword == "Columns");
    // The default style parameter is kSolutionStyleRaw, and this still
    // allows sparse files to be read. Recognise the latter from num_col
    // <= 0. Doesn't matter if num_col = 0, since there's nothing to
    // read either way
    sparse = num_col <= 0;
    if (style == kSolutionStyleSparse) assert(sparse);
    if (sparse) {
      num_col = -num_col;
      assert(num_col <= lp_num_col);
    } else {
      if (num_col != lp_num_col) {
        highsLogUser(log_options, HighsLogType::kError,
                     "readSolutionFile: Solution file is for %" HIGHSINT_FORMAT
                     " columns, not %" HIGHSINT_FORMAT "\n",
                     num_col, lp_num_col);
        return readSolutionFileErrorReturn(in_file);
      }
    }
  }
  if (miplib_sol) {
    HighsInt num_value = 0;
    read_solution.col_value.assign(lp_num_col, 0);
    for (;;) {
      // Only false return is for encountering EOF
      if (!readSolutionFileIdDoubleLineOk(name, value, in_file)) break;
      auto search = lp.col_hash_.name2index.find(name);
      if (search == lp.col_hash_.name2index.end()) {
        highsLogUser(log_options, HighsLogType::kError,
                     "readSolutionFile: name %s is not found\n", name.c_str());
        return HighsStatus::kError;
      } else if (search->second == kHashIsDuplicate) {
        highsLogUser(log_options, HighsLogType::kError,
                     "readSolutionFile: name %s is duplicated\n", name.c_str());
        return HighsStatus::kError;
      }
      HighsInt iCol = search->second;
      assert(lp.col_names_[iCol] == name);
      read_solution.col_value[iCol] = value;
      num_value++;
      if (in_file.eof()) break;
    }
  } else if (sparse) {
    read_solution.col_value.assign(lp_num_col, 0);
    HighsInt iCol;
    for (HighsInt iX = 0; iX < num_col; iX++) {
      if (!readSolutionFileIdDoubleIntLineOk(value, iCol, in_file))
        return readSolutionFileErrorReturn(in_file);
      read_solution.col_value[iCol] = value;
    }
  } else {
    for (HighsInt iCol = 0; iCol < num_col; iCol++) {
      if (!readSolutionFileIdDoubleLineOk(name, value, in_file))
        return readSolutionFileErrorReturn(in_file);
      read_solution.col_value[iCol] = value;
    }
  }
  read_solution.value_valid = true;
  if (sparse) {
    if (calculateRowValuesQuad(lp, read_solution.col_value,
                               read_solution.row_value) != HighsStatus::kOk)
      return readSolutionFileErrorReturn(in_file);
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis, in_file);
  }
  // Read in the col values: OK to have none, otherwise next line
  // should be "Rows" and correct number
  if (!readSolutionFileHashKeywordIntLineOk(keyword, num_row, in_file)) {
    // Compute the row values since there are none to read
    if (calculateRowValuesQuad(lp, read_solution.col_value,
                               read_solution.row_value) != HighsStatus::kOk)
      return readSolutionFileErrorReturn(in_file);
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis, in_file);
  }
  assert(keyword == "Rows");
  // OK to read from a file with different number of rows, since the
  // primal solution is all that's important. For example, see #1284,
  // where the user is solving a sequence of MIPs with the same number
  // of variables, but increasing numbers of constraints, and wants to
  // used the solution from one MIP as the starting solution for the
  // next.
  const bool num_row_ok = num_row == lp_num_row;
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    if (!readSolutionFileIdDoubleLineOk(name, value, in_file))
      return readSolutionFileErrorReturn(in_file);
    if (num_row_ok) read_solution.row_value[iRow] = value;
  }
  if (!num_row_ok) {
    highsLogUser(log_options, HighsLogType::kWarning,
                 "readSolutionFile: Solution file is for %" HIGHSINT_FORMAT
                 " rows, not %" HIGHSINT_FORMAT ": row values ignored\n",
                 num_row, lp_num_row);
    // Calculate the row values
    if (calculateRowValuesQuad(lp, read_solution.col_value,
                               read_solution.row_value) != HighsStatus::kOk)
      return readSolutionFileErrorReturn(in_file);
  }
  // OK to have no EOL
  if (!readSolutionFileIgnoreLineOk(in_file))
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis,
                                  in_file);  // EOL
  // OK to have no blank line
  if (!readSolutionFileIgnoreLineOk(in_file))
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis,
                                  in_file);  //
  // OK to have no reference to dual solution values
  if (!readSolutionFileIgnoreLineOk(in_file))
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis,
                                  in_file);  // # Dual solution values
  // If there's a reference to dual solution values, there's a keyword
  // to indicate their status
  if (!readSolutionFileKeywordLineOk(keyword, in_file))
    return readSolutionFileErrorReturn(in_file);
  if (keyword != "None") {
    if (!readSolutionFileIgnoreLineOk(in_file))
      return readSolutionFileErrorReturn(in_file);  // EOL
    // Next line should be "Columns" and correct number
    if (!readSolutionFileHashKeywordIntLineOk(keyword, num_col, in_file))
      return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                    read_solution, read_basis, in_file);
    assert(keyword == "Columns");
    double dual;
    for (HighsInt iCol = 0; iCol < num_col; iCol++) {
      if (!readSolutionFileIdDoubleLineOk(name, dual, in_file))
        return readSolutionFileErrorReturn(in_file);
      read_solution.col_dual[iCol] = dual;
    }
    // Read in the col values: next line should be "Rows" and correct
    // number
    if (!readSolutionFileHashKeywordIntLineOk(keyword, num_row, in_file))
      return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                    read_solution, read_basis, in_file);
    assert(keyword == "Rows");
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      if (!readSolutionFileIdDoubleLineOk(name, dual, in_file))
        return readSolutionFileErrorReturn(in_file);
      read_solution.row_dual[iRow] = dual;
    }
  }
  // OK to have no EOL
  if (!readSolutionFileIgnoreLineOk(in_file))
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis,
                                  in_file);  // EOL
  // OK to have no blank line
  if (!readSolutionFileIgnoreLineOk(in_file))
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis,
                                  in_file);  //
  // OK to have no reference to basis
  if (!readSolutionFileIgnoreLineOk(in_file))
    return readSolutionFileReturn(HighsStatus::kOk, solution, basis,
                                  read_solution, read_basis,
                                  in_file);  // # Basis
  HighsStatus basis_read_status =
      readBasisStream(log_options, read_basis, in_file);
  // Return with basis read status
  return readSolutionFileReturn(basis_read_status, solution, basis,
                                read_solution, read_basis, in_file);
}